

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O0

int hitmm(monst *magr,monst *mdef,attack *mattk)

{
  boolean bVar1;
  int iVar2;
  obj *poVar3;
  char *pcVar4;
  char *pcVar5;
  char local_328 [8];
  char magr_name [256];
  char mdef_name [256];
  char buf [256];
  int compat;
  attack *mattk_local;
  monst *mdef_local;
  monst *magr_local;
  
  if (vis == '\0') {
    noises(magr,mattk);
    goto LAB_0021647c;
  }
  if (magr->wormno == '\0') {
    if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((magr->data->mflags3 & 0x200) != 0 && ((viz_array[magr->my][magr->mx] & 1U) != 0))))))))
    goto LAB_00215bc0;
LAB_00215c4d:
    if (((((magr->data->mflags1 & 0x10000) != 0) ||
         ((poVar3 = which_armor(magr,4), poVar3 != (obj *)0x0 &&
          (poVar3 = which_armor(magr,4), poVar3->otyp == 0x4f)))) ||
        ((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
           (((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
            (u.uprops[0x19].blocked != 0)))))) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar2 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy), 0x40 < iVar2)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        (bVar1 = match_warn_of_mon(magr), bVar1 == '\0')))) {
      map_invisible(magr->mx,magr->my);
    }
  }
  else {
    bVar1 = worm_known(level,magr);
    if (bVar1 == '\0') goto LAB_00215c4d;
LAB_00215bc0:
    if (((((((*(uint *)&magr->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&magr->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&magr->field_0x60 >> 9 & 1) != 0)
         ))) || (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_00215c4d;
  }
  if (mdef->wormno == '\0') {
    if (((viz_array[mdef->my][mdef->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((mdef->data->mflags3 & 0x200) != 0 && ((viz_array[mdef->my][mdef->mx] & 1U) != 0))))))))
    goto LAB_00215f83;
LAB_00216010:
    if (((((mdef->data->mflags1 & 0x10000) != 0) ||
         ((poVar3 = which_armor(mdef,4), poVar3 != (obj *)0x0 &&
          (poVar3 = which_armor(mdef,4), poVar3->otyp == 0x4f)))) ||
        ((((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
           ((((u.uprops[0x19].intrinsic == 0 &&
              ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
             (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))) ||
          (u.uprops[0x19].blocked != 0)) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar2 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), 0x40 < iVar2)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        (bVar1 = match_warn_of_mon(mdef), bVar1 == '\0')))) {
      map_invisible(mdef->mx,mdef->my);
    }
  }
  else {
    bVar1 = worm_known(level,mdef);
    if (bVar1 == '\0') goto LAB_00216010;
LAB_00215f83:
    if (((((((*(uint *)&mdef->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&mdef->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&mdef->field_0x60 >> 9 & 1) != 0)
         ))) || (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_00216010;
  }
  if (mdef->m_ap_type != '\0') {
    seemimic(mdef);
  }
  if (magr->m_ap_type != '\0') {
    seemimic(magr);
  }
  iVar2 = could_seduce(magr,mdef,mattk);
  if ((iVar2 != 0) && ((*(uint *)&magr->field_0x60 >> 8 & 1) == 0)) {
    pcVar4 = Monnam(magr);
    pcVar5 = "talks to";
    if ((*(uint *)&mdef->field_0x60 >> 0x11 & 1) != 0) {
      pcVar5 = "smiles at";
    }
    sprintf(mdef_name + 0xf8,"%s %s",pcVar4,pcVar5);
    pcVar4 = mon_nam(mdef);
    pcVar5 = "seductively";
    if (iVar2 == 2) {
      pcVar5 = "engagingly";
    }
    pline("%s %s %s.",mdef_name + 0xf8,pcVar4,pcVar5);
    goto LAB_0021647c;
  }
  pcVar4 = Monnam(magr);
  strcpy(local_328,pcVar4);
  switch(mattk->aatyp) {
  case '\x02':
    sprintf(mdef_name + 0xf8,"%s bites",local_328);
    break;
  default:
switchD_00216329_caseD_3:
    sprintf(mdef_name + 0xf8,"%s hits",local_328);
    break;
  case '\x04':
    sprintf(mdef_name + 0xf8,"%s butts",local_328);
    break;
  case '\x05':
    sprintf(mdef_name + 0xf8,"%s touches",local_328);
    break;
  case '\x06':
    sprintf(mdef_name + 0xf8,"%s stings",local_328);
    break;
  case '\a':
    if (magr == u.ustuck) goto switchD_00216329_caseD_3;
    sprintf(mdef_name + 0xf8,"%s squeezes",local_328);
    break;
  case '\x10':
    pcVar4 = s_suffix(local_328);
    sprintf(mdef_name + 0xf8,"%s tentacles suck",pcVar4);
  }
  pcVar4 = mon_nam_too(magr_name + 0xf8,mdef,magr);
  pline("%s %s.",mdef_name + 0xf8,pcVar4);
LAB_0021647c:
  iVar2 = mdamagem(magr,mdef,mattk);
  return iVar2;
}

Assistant:

static int hitmm(struct monst *magr, struct monst *mdef, const struct attack *mattk)
{
	if (vis){
		int compat;
		char buf[BUFSZ], mdef_name[BUFSZ];

		if (!canspotmon(level, magr))
		    map_invisible(magr->mx, magr->my);
		if (!canspotmon(level, mdef))
		    map_invisible(mdef->mx, mdef->my);
		if (mdef->m_ap_type) seemimic(mdef);
		if (magr->m_ap_type) seemimic(magr);
		if ((compat = could_seduce(magr,mdef,mattk)) && !magr->mcan) {
			sprintf(buf, "%s %s", Monnam(magr),
				mdef->mcansee ? "smiles at" : "talks to");
			pline("%s %s %s.", buf, mon_nam(mdef),
				compat == 2 ?
					"engagingly" : "seductively");
		} else {
		    char magr_name[BUFSZ];

		    strcpy(magr_name, Monnam(magr));
		    switch (mattk->aatyp) {
			case AT_BITE:
				sprintf(buf,"%s bites", magr_name);
				break;
			case AT_STNG:
				sprintf(buf,"%s stings", magr_name);
				break;
			case AT_BUTT:
				sprintf(buf,"%s butts", magr_name);
				break;
			case AT_TUCH:
				sprintf(buf,"%s touches", magr_name);
				break;
			case AT_TENT:
				sprintf(buf, "%s tentacles suck",
					s_suffix(magr_name));
				break;
			case AT_HUGS:
				if (magr != u.ustuck) {
				    sprintf(buf,"%s squeezes", magr_name);
				    break;
				}
			default:
				sprintf(buf,"%s hits", magr_name);
		    }
		    pline("%s %s.", buf, mon_nam_too(mdef_name, mdef, magr));
		}
	} else  noises(magr, mattk);
	return mdamagem(magr, mdef, mattk);
}